

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O0

void FT_List_Finalize(FT_List list,FT_List_Destructor destroy,FT_Memory memory,void *user)

{
  FT_ListNode pFVar1;
  void *data;
  FT_ListNode next;
  FT_ListNode cur;
  void *user_local;
  FT_Memory memory_local;
  FT_List_Destructor destroy_local;
  FT_List list_local;
  
  if ((list != (FT_List)0x0) && (memory != (FT_Memory)0x0)) {
    next = list->head;
    while (next != (FT_ListNode)0x0) {
      pFVar1 = next->next;
      if (destroy != (FT_List_Destructor)0x0) {
        (*destroy)(memory,next->data,user);
      }
      ft_mem_free(memory,next);
      next = pFVar1;
    }
    list->head = (FT_ListNode)0x0;
    list->tail = (FT_ListNode)0x0;
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_List_Finalize( FT_List             list,
                    FT_List_Destructor  destroy,
                    FT_Memory           memory,
                    void*               user )
  {
    FT_ListNode  cur;


    if ( !list || !memory )
      return;

    cur = list->head;
    while ( cur )
    {
      FT_ListNode  next = cur->next;
      void*        data = cur->data;


      if ( destroy )
        destroy( memory, data, user );

      FT_FREE( cur );
      cur = next;
    }

    list->head = NULL;
    list->tail = NULL;
  }